

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * QByteArray::trimmed_helper(QByteArray *a)

{
  QByteArray *in_RDI;
  QByteArray *unaff_retaddr;
  
  QStringAlgorithms<QByteArray>::trimmed_helper(unaff_retaddr);
  return in_RDI;
}

Assistant:

QByteArray QByteArray::trimmed_helper(QByteArray &a)
{
    return QStringAlgorithms<QByteArray>::trimmed_helper(a);
}